

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_switch_std_to_buffer(int *std_pipe,FILE *out,int fileno_,int *save_handle)

{
  int iVar1;
  int *save_handle_local;
  int fileno__local;
  FILE *out_local;
  int *std_pipe_local;
  
  fflush((FILE *)out);
  iVar1 = dup(fileno_);
  *save_handle = iVar1;
  iVar1 = pipe(std_pipe);
  if (iVar1 != 0) {
    exit(1);
  }
  dup2(std_pipe[1],fileno_);
  close(std_pipe[1]);
  return;
}

Assistant:

static void
fct_switch_std_to_buffer(int std_pipe[2], FILE *out, int fileno_, int *save_handle)
{
    fflush(out);
    *save_handle = _fct_dup(fileno_);
    if ( _fct_pipe(std_pipe) != 0 )
    {
        exit(1);
    }
    _fct_dup2(std_pipe[1], fileno_);
    _fct_close(std_pipe[1]);
}